

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clownlzss.c
# Opt level: O3

int ClownLZSS_FindOptimalMatches
              (int filler_value,size_t maximum_match_length,size_t maximum_match_distance,
              _func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr
              *extra_matches_callback,size_t literal_cost,
              _func_size_t_size_t_size_t_void_ptr *match_cost_callback,uchar *data,
              size_t bytes_per_value,size_t total_values,ClownLZSS_Match **_matches,
              size_t *_total_matches,void *user)

{
  long lVar1;
  size_t sVar2;
  ClownLZSS_Match *pCVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ClownLZSS_Match *pCVar7;
  size_t sVar8;
  ClownLZSS_Match *pCVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  size_t *psVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  uchar *puVar19;
  uchar *puVar20;
  uchar *puVar21;
  size_t sVar22;
  uchar *puVar23;
  uchar *puVar24;
  uchar *puVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  sVar8 = 0;
  if (total_values == 0) {
    pCVar7 = (ClownLZSS_Match *)0x0;
  }
  else {
    pCVar7 = (ClownLZSS_Match *)malloc(maximum_match_distance * 0x10 + total_values * 0x18 + 0x818);
    if (pCVar7 == (ClownLZSS_Match *)0x0) {
      return 0;
    }
    uVar27 = total_values + 1;
    pCVar3 = pCVar7 + uVar27;
    memset((anon_union_8_2_f60ed377_for_u *)&pCVar3->source + maximum_match_distance * 2,0xff,0x800)
    ;
    if (filler_value == -1) {
      if (maximum_match_distance != 0) {
        memset(pCVar3,0xff,maximum_match_distance * 8);
      }
    }
    else {
      sVar8 = maximum_match_distance - 1;
      ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)
      [maximum_match_distance + (long)filler_value + maximum_match_distance].cost = sVar8;
      ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)[maximum_match_distance].cost =
           0xffffffffffffffff;
      *(size_t *)((long)pCVar3 + maximum_match_distance * 8 + -8) =
           (long)filler_value + maximum_match_distance;
      if (sVar8 != 0) {
        sVar16 = 0;
        do {
          sVar22 = sVar16 + 1;
          (&pCVar3->destination)[maximum_match_distance + sVar16] = sVar16;
          ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)[sVar16].cost = sVar22;
          sVar16 = sVar22;
        } while (sVar22 != sVar8);
      }
    }
    ((anon_union_8_2_f60ed377_for_u *)&pCVar7->source)->cost = 0;
    auVar6 = _DAT_0010b5b0;
    auVar5 = _DAT_0010b5a0;
    if (1 < uVar27) {
      lVar1 = total_values - 1;
      auVar28._8_4_ = (int)lVar1;
      auVar28._0_8_ = lVar1;
      auVar28._12_4_ = (int)((ulong)lVar1 >> 0x20);
      uVar14 = 0;
      auVar28 = auVar28 ^ _DAT_0010b5b0;
      pCVar9 = pCVar7;
      do {
        auVar29._8_4_ = (int)uVar14;
        auVar29._0_8_ = uVar14;
        auVar29._12_4_ = (int)(uVar14 >> 0x20);
        auVar29 = (auVar29 | auVar5) ^ auVar6;
        if ((bool)(~(auVar29._4_4_ == auVar28._4_4_ && auVar28._0_4_ < auVar29._0_4_ ||
                    auVar28._4_4_ < auVar29._4_4_) & 1)) {
          ((anon_union_8_2_f60ed377_for_u *)&pCVar9[1].source)->cost = 0xffffffffffffffff;
        }
        if ((auVar29._12_4_ != auVar28._12_4_ || auVar29._8_4_ <= auVar28._8_4_) &&
            auVar29._12_4_ <= auVar28._12_4_) {
          ((anon_union_8_2_f60ed377_for_u *)&pCVar9[2].source)->cost = 0xffffffffffffffff;
        }
        uVar14 = uVar14 + 2;
        pCVar9 = pCVar9 + 2;
      } while ((uVar27 & 0xfffffffffffffffe) != uVar14);
    }
    uVar14 = (ulong)(bytes_per_value == 1);
    sVar8 = total_values;
    uVar27 = 0;
    do {
      uVar15 = sVar8;
      if (maximum_match_length < sVar8) {
        uVar15 = maximum_match_length;
      }
      bVar4 = data[uVar27 * bytes_per_value];
      uVar17 = uVar27 % maximum_match_distance;
      if (extra_matches_callback !=
          (_func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr *)0x0) {
        (*extra_matches_callback)(data,total_values,uVar27,(ClownLZSS_GraphEdge *)pCVar7,user);
      }
      sVar22 = bVar4 + maximum_match_distance;
      sVar16 = ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)[maximum_match_distance + sVar22].
               cost;
      if (sVar16 != 0xffffffffffffffff) {
        uVar26 = total_values - uVar27;
        if (maximum_match_length <= total_values - uVar27) {
          uVar26 = maximum_match_length;
        }
        pCVar9 = pCVar7 + uVar27;
        do {
          uVar18 = (~sVar16 + uVar27 + maximum_match_distance) % maximum_match_distance;
          if (uVar14 < uVar26) {
            sVar2 = uVar18 + 1;
            puVar19 = data + (uVar14 + uVar27) * bytes_per_value;
            puVar23 = data + (uVar14 + uVar27) * bytes_per_value + ~uVar18 * bytes_per_value;
            uVar18 = uVar14;
            do {
              if (puVar23 < data) {
                if (bytes_per_value == 0) {
                  sVar11 = 0;
                  puVar21 = puVar19;
                }
                else {
                  sVar10 = 0;
                  puVar25 = puVar19;
                  do {
                    sVar11 = sVar10;
                    puVar21 = puVar25 + 1;
                    if (*puVar25 != (uchar)filler_value) break;
                    sVar10 = sVar10 + 1;
                    sVar11 = bytes_per_value;
                    puVar21 = puVar19 + bytes_per_value;
                    puVar25 = puVar25 + 1;
                  } while (bytes_per_value != sVar10);
                }
                puVar19 = puVar21;
                puVar23 = puVar23 + bytes_per_value;
LAB_0010a63b:
                puVar25 = puVar23;
                puVar21 = puVar19;
                if (sVar11 != bytes_per_value) break;
              }
              else {
                if (bytes_per_value == 0) {
                  sVar11 = 0;
                  goto LAB_0010a63b;
                }
                puVar21 = puVar19 + bytes_per_value;
                puVar25 = puVar23 + bytes_per_value;
                sVar11 = 0;
                puVar20 = puVar19;
                puVar24 = puVar23;
                do {
                  puVar19 = puVar20 + 1;
                  puVar23 = puVar24 + 1;
                  if (*puVar20 != *puVar24) goto LAB_0010a63b;
                  sVar11 = sVar11 + 1;
                  puVar20 = puVar20 + 1;
                  puVar24 = puVar24 + 1;
                } while (bytes_per_value != sVar11);
              }
              sVar11 = uVar18 + 1;
              sVar10 = (*match_cost_callback)(sVar2,sVar11,user);
              if ((sVar10 != 0) &&
                 (uVar12 = sVar10 + ((anon_union_8_2_f60ed377_for_u *)&pCVar9->source)->cost,
                 uVar12 < ((anon_union_8_2_f60ed377_for_u *)&pCVar9[uVar18 + 1].source)->cost)) {
                ((anon_union_8_2_f60ed377_for_u *)&pCVar9[uVar18 + 1].source)->cost = uVar12;
                pCVar9[uVar18 + 1].destination = uVar27;
                pCVar9[uVar18 + 1].length = uVar27 - sVar2;
              }
              puVar19 = puVar21;
              puVar23 = puVar25;
              uVar18 = sVar11;
            } while (sVar11 != uVar15);
          }
          sVar16 = ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)
                   [maximum_match_distance + sVar16].cost;
        } while (sVar16 != 0xffffffffffffffff);
      }
      sVar16 = uVar27 + 1;
      uVar15 = ((anon_union_8_2_f60ed377_for_u *)&pCVar7[uVar27].source)->cost + literal_cost;
      if (uVar15 <= ((anon_union_8_2_f60ed377_for_u *)&pCVar7[uVar27 + 1].source)->cost) {
        ((anon_union_8_2_f60ed377_for_u *)&pCVar7[uVar27 + 1].source)->cost = uVar15;
        pCVar7[uVar27 + 1].destination = uVar27;
        pCVar7[uVar27 + 1].length = sVar16;
      }
      if (((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)[uVar17].cost != 0xffffffffffffffff) {
        ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)
        [maximum_match_distance + ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)[uVar17].cost].
        cost = 0xffffffffffffffff;
      }
      ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)[uVar17].cost = sVar22;
      sVar2 = ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)[maximum_match_distance + sVar22].
              cost;
      ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)[maximum_match_distance + uVar17].cost =
           sVar2;
      if (sVar2 != 0xffffffffffffffff) {
        ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)[sVar2].cost = uVar17;
      }
      ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)[maximum_match_distance + sVar22].cost =
           uVar17;
      sVar8 = sVar8 - 1;
      uVar27 = sVar16;
    } while (sVar16 != total_values);
    pCVar7->destination = 0xffffffffffffffff;
    ((anon_union_8_2_f60ed377_for_u *)&pCVar7[total_values].source)->cost = 0xffffffffffffffff;
    sVar8 = pCVar7[total_values].destination;
    while (sVar16 = sVar8, sVar16 != 0xffffffffffffffff) {
      ((anon_union_8_2_f60ed377_for_u *)&pCVar7[sVar16].source)->cost = total_values;
      total_values = sVar16;
      sVar8 = pCVar7[sVar16].destination;
    }
    if (((anon_union_8_2_f60ed377_for_u *)&pCVar7->source)->cost == 0xffffffffffffffff) {
      sVar8 = 0;
    }
    else {
      psVar13 = &pCVar7->length;
      sVar8 = 0;
      sVar16 = 0;
      sVar22 = ((anon_union_8_2_f60ed377_for_u *)&pCVar7->source)->cost;
      do {
        ((ClownLZSS_GraphEdge *)(psVar13 + -2))->u =
             (anon_union_8_2_f60ed377_for_u)pCVar7[sVar22].length;
        psVar13[-1] = sVar16;
        *psVar13 = sVar22 - sVar16;
        sVar8 = sVar8 + 1;
        pCVar3 = pCVar7 + sVar22;
        psVar13 = psVar13 + 3;
        sVar16 = sVar22;
        sVar22 = ((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)->cost;
      } while (((anon_union_8_2_f60ed377_for_u *)&pCVar3->source)->cost != 0xffffffffffffffff);
    }
  }
  *_matches = pCVar7;
  *_total_matches = sVar8;
  return 1;
}

Assistant:

int ClownLZSS_FindOptimalMatches(
	const int filler_value,
	const size_t maximum_match_length,
	const size_t maximum_match_distance,
	void (* const extra_matches_callback)(const unsigned char *data, size_t total_values, size_t offset, ClownLZSS_GraphEdge *node_meta_array, void *user),
	const size_t literal_cost,
	size_t (* const match_cost_callback)(size_t distance, size_t length, void *user),
	const unsigned char* const data,
	const size_t bytes_per_value,
	const size_t total_values,
	ClownLZSS_Match** const _matches,
	size_t* const _total_matches,
	const void* const user
)
{
	int success;

	success = 0;

	/* Handle the edge-case where the data is empty. */
	if (total_values == 0)
	{
		*_matches = NULL;
		*_total_matches = 0;
		success = 1;
	}
	else
	{
		const size_t node_meta_array_length = total_values + 1; /* +1 for the end-node */
		const size_t string_list_buffer_length = maximum_match_distance * 2 + 0x100;
		ClownLZSS_GraphEdge* const node_meta_array = (ClownLZSS_GraphEdge*)malloc(node_meta_array_length * sizeof(ClownLZSS_GraphEdge) + string_list_buffer_length * sizeof(size_t));

		if (node_meta_array != NULL)
		{
			size_t i;
			ClownLZSS_Match *matches;
			size_t total_matches;

			size_t* const prev = (size_t*)&node_meta_array[node_meta_array_length];
			size_t* const next = &prev[maximum_match_distance];
			const size_t DUMMY = -1;

			/* Initialise the string list heads */
			for (i = 0; i < 0x100; ++i)
				next[maximum_match_distance + i] = DUMMY;

			if (filler_value == -1)
			{
				/* Initialise the string list nodes */
				for (i = 0; i < maximum_match_distance; ++i)
					prev[i] = DUMMY;
			}
			else
			{
				next[maximum_match_distance + filler_value] = maximum_match_distance - 1;
				next[0] = DUMMY;
				prev[maximum_match_distance - 1] = maximum_match_distance + filler_value;

				/* Initialise the string list nodes */
				for (i = 0; i < maximum_match_distance - 1; ++i)
				{
					next[i + 1] = i;
					prev[i] = i + 1;
				}
			}

			/* Set costs to maximum possible value, so later comparisons work */
			node_meta_array[0].u.cost = 0;
			for (i = 1; i < total_values + 1; ++i)
				node_meta_array[i].u.cost = DUMMY;

			/* Search for matches, to populate the edges of the LZSS graph.
			   Notably, while doing this, we're also using a shortest-path
			   algorithm on the edges to find the best combination of matches
			   to produce the smallest file. */

			/* Advance through the data one step at a time */
			for (i = 0; i < total_values; ++i)
			{
				size_t match_string;

				const size_t string_list_head = maximum_match_distance + data[i * bytes_per_value];
				const size_t current_string = i % maximum_match_distance;

				if (extra_matches_callback != NULL)
					extra_matches_callback(data, total_values, i, node_meta_array, (void*)user);

				/* `string_list_head` points to a linked-list of strings in the LZSS sliding window that match at least
				   one byte with the current string: iterate over it and generate every possible match for this string */
				for (match_string = next[string_list_head]; match_string != DUMMY; match_string = next[match_string])
				{
					size_t j;

					const size_t distance = ((maximum_match_distance + i - match_string - 1) % maximum_match_distance) + 1;
					/* If `BYTES_PER_VALUE` is not 1, then we have to re-evaluate the first value, otherwise we can skip it */
					const unsigned int start = bytes_per_value == 1;
					const unsigned char *current_bytes = &data[(i + start) * bytes_per_value];
					const unsigned char *match_bytes = current_bytes - distance * bytes_per_value;

					for (j = start; j < CLOWNLZSS_MIN(maximum_match_length, total_values - i); ++j)
					{
						size_t l;

						if (match_bytes < data)
						{
							for (l = 0; l < bytes_per_value; ++l)
							{
								const unsigned char current_byte = *current_bytes;
								const unsigned char match_byte = (unsigned char)filler_value;

								++current_bytes;

								if (current_byte != match_byte)
									break;
							}

							match_bytes += bytes_per_value;
						}
						else
						{
							for (l = 0; l < bytes_per_value; ++l)
							{
								const unsigned char current_byte = *current_bytes;
								const unsigned char match_byte = *match_bytes;

								++current_bytes;
								++match_bytes;

								if (current_byte != match_byte)
									break;
							}
						}

						if (l != bytes_per_value)
						{
							/* No match: give up on the current run */
							break;
						}
						else
						{
							/* Figure out how much it costs to encode the current run */
							const size_t cost = match_cost_callback(distance, j + 1, (void*)user);

							/* Figure out if the cost is lower than that of any other runs that end at the same value as this one */
							if (cost != 0 && node_meta_array[i + j + 1].u.cost > node_meta_array[i].u.cost + cost)
							{
								/* Record this new best run in the graph edge assigned to the value at the end of the run */
								node_meta_array[i + j + 1].u.cost = node_meta_array[i].u.cost + cost;
								node_meta_array[i + j + 1].previous_node_index = i;
								node_meta_array[i + j + 1].match_offset = i - distance;
							}
						}
					}
				}

				/* If a literal match is more efficient than all runs assigned to this value, then use that instead */
				if (node_meta_array[i + 1].u.cost >= node_meta_array[i].u.cost + literal_cost)
				{
					node_meta_array[i + 1].u.cost = node_meta_array[i].u.cost + literal_cost;
					node_meta_array[i + 1].previous_node_index = i;
					node_meta_array[i + 1].match_offset = i + 1;
				}

				/* Replace the oldest string in the list with the new string, since it's about to be pushed out of the LZSS sliding window */

				/* Detach the old node in this slot */
				if (prev[current_string] != DUMMY)
					next[prev[current_string]] = DUMMY;

				/* Replace the old node with this new one, and insert it at the start of its matching list */
				prev[current_string] = string_list_head;
				next[current_string] = next[string_list_head];

				if (next[current_string] != DUMMY)
					prev[next[current_string]] = current_string;

				next[string_list_head] = current_string;
			}

			/* At this point, the edges will have formed a shortest-path from the start to the end:
			   You just have to start at the last edge, and follow it backwards all the way to the start. */

			/* Mark start/end nodes for the following loops */
			node_meta_array[0].previous_node_index = DUMMY;
			node_meta_array[total_values].u.next_node_index = DUMMY;

			/* Reverse the direction of the edges, so we can parse the LZSS graph from start to end */
			for (i = total_values; node_meta_array[i].previous_node_index != DUMMY; i = node_meta_array[i].previous_node_index)
				node_meta_array[node_meta_array[i].previous_node_index].u.next_node_index = i;

			/* Produce an array of LZSS matches for the caller to process. It's safe to overwrite the LZSS graph to do this. */
			matches = (ClownLZSS_Match*)node_meta_array;
			total_matches = 0;

			i = 0;
			while (node_meta_array[i].u.next_node_index != DUMMY)
			{
				const size_t next_index = node_meta_array[i].u.next_node_index;
				const size_t offset = node_meta_array[next_index].match_offset;

				matches[total_matches].source = offset;
				matches[total_matches].destination = i;
				matches[total_matches].length = next_index - i;

				++total_matches;

				i = next_index;
			}

			*_matches = matches;
			*_total_matches = total_matches;
			success = 1;
		}
	}

	return success;
}